

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

cmDocumentationSection * __thiscall cmDocumentation::SectionAtName(cmDocumentation *this,char *name)

{
  pointer ppVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_bool>
  pVar2;
  cmDocumentationSection local_60;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>
  local_28;
  undefined1 local_20;
  char *local_18;
  char *name_local;
  cmDocumentation *this_local;
  
  local_18 = name;
  name_local = &this->ShowGenerators;
  cmDocumentationSection::cmDocumentationSection(&local_60,name);
  pVar2 = std::
          map<std::__cxx11::string,cmDocumentationSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
          ::emplace<char_const*&,cmDocumentationSection>
                    ((map<std::__cxx11::string,cmDocumentationSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
                      *)&this->AllSections,&local_18,&local_60);
  local_28 = pVar2.first._M_node;
  local_20 = pVar2.second;
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>
           ::operator->(&local_28);
  cmDocumentationSection::~cmDocumentationSection(&local_60);
  return &ppVar1->second;
}

Assistant:

cmDocumentationSection& cmDocumentation::SectionAtName(const char* name)
{
  return this->AllSections.emplace(name, cmDocumentationSection{ name })
    .first->second;
}